

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

ConstNodeRef __thiscall c4::yml::Tree::ref(Tree *this,size_t id)

{
  pfn_error p_Var1;
  Location LVar2;
  bool bVar3;
  error_flags eVar4;
  ulong in_RSI;
  Tree *in_RDI;
  char msg [53];
  size_t in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  size_t local_60;
  char local_58 [56];
  ulong local_20;
  ConstNodeRef local_10;
  
  local_20 = in_RSI;
  if ((in_RSI == 0xffffffffffffffff) || (in_RDI->m_size <= in_RSI)) {
    memcpy(local_58,"check failed: (id != NONE && id >= 0 && id < m_size)",0x35);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_callbacks).m_error;
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    LVar2.super_LineCol.line = uStack_78;
    LVar2.super_LineCol.offset = local_80;
    LVar2.super_LineCol.col = local_70;
    LVar2.name.str = (char *)uStack_68;
    LVar2.name.len = local_60;
    (*p_Var1)(local_58,0x35,LVar2,(in_RDI->m_callbacks).m_user_data);
  }
  ConstNodeRef::ConstNodeRef(&local_10,in_RDI,local_20);
  return local_10;
}

Assistant:

ConstNodeRef Tree::ref(size_t id) const
{
    _RYML_CB_ASSERT(m_callbacks, id != NONE && id >= 0 && id < m_size);
    return ConstNodeRef(this, id);
}